

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O1

TEdge * ClipperLib::FindNextLocMin(TEdge *E)

{
  TEdge *pTVar1;
  long lVar2;
  long lVar3;
  TEdge *pTVar4;
  
  while( true ) {
    for (; ((pTVar1 = E->Prev, (E->Bot).X != (pTVar1->Bot).X || ((E->Bot).Y != (pTVar1->Bot).Y)) ||
           (((E->Curr).X == (E->Top).X && ((E->Curr).Y == (E->Top).Y)))); E = E->Next) {
    }
    if (((E->Dx != -1e+40) || (NAN(E->Dx))) && ((pTVar1->Dx != -1e+40 || (NAN(pTVar1->Dx))))) break;
    do {
      pTVar4 = E;
      pTVar1 = pTVar4->Prev;
      E = pTVar1;
    } while (pTVar1->Dx == -1e+40);
    E = pTVar4;
    if ((pTVar4->Dx == -1e+40) && (!NAN(pTVar4->Dx))) {
      do {
        E = E->Next;
      } while (E->Dx == -1e+40);
    }
    lVar2 = (E->Top).Y;
    lVar3 = (E->Prev->Bot).Y;
    if ((lVar2 != lVar3) && ((pTVar1->Bot).X < (E->Bot).X)) {
      E = pTVar4;
    }
    if (lVar2 != lVar3) {
      return E;
    }
  }
  return E;
}

Assistant:

TEdge* FindNextLocMin(TEdge* E)
{
  for (;;)
  {
    while (E->Bot != E->Prev->Bot || E->Curr == E->Top) E = E->Next;
    if (!IsHorizontal(*E) && !IsHorizontal(*E->Prev)) break;
    while (IsHorizontal(*E->Prev)) E = E->Prev;
    TEdge* E2 = E;
    while (IsHorizontal(*E)) E = E->Next;
    if (E->Top.Y == E->Prev->Bot.Y) continue; //ie just an intermediate horz.
    if (E2->Prev->Bot.X < E->Bot.X) E = E2;
    break;
  }
  return E;
}